

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

word Nf_MatchRef_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,int Required,Vec_Int_t *vBackup)

{
  int iVar1;
  int iVar2;
  int *pCutSet;
  uint *puVar3;
  word wVar4;
  byte bVar5;
  uint uVar6;
  word *pwVar7;
  uint c_00;
  ulong uVar8;
  bool bVar9;
  word local_58;
  
  if (-1 < (int)*(uint *)pM) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x6b9,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)")
    ;
  }
  if (Required < pM->D) {
    __assert_fail("pM->D <= Required",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x6ba,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)")
    ;
  }
  if ((*(uint *)pM >> 0x1e & 1) == 0) {
    iVar1 = Vec_IntEntry(&p->vCutSets,i);
    if (iVar1 == 0) {
      return 0;
    }
    pCutSet = Nf_ObjCutSet(p,i);
    puVar3 = (uint *)Nf_CutFromHandle(pCutSet,*(uint *)pM >> 0x14 & 0x3ff);
    bVar5 = 0;
    local_58 = 0;
    for (uVar8 = 0; uVar8 < (*puVar3 & 0x1f); uVar8 = uVar8 + 1) {
      uVar6 = puVar3[(ulong)(((uint)pM->Cfg >> 8) >> (bVar5 & 0x1f) & 0xf) + 1];
      if ((long)(int)uVar6 == 0) break;
      bVar9 = (((uint)pM->Cfg >> 1 & 0x7f) >> ((uint)uVar8 & 0x1f) & 1) != 0;
      iVar1 = p->pCells[*(uint *)pM & 0xfffff].iDelays[uVar8];
      c_00 = (uint)bVar9;
      if (vBackup != (Vec_Int_t *)0x0) {
        iVar2 = Abc_Var2Lit(uVar6,c_00);
        Vec_IntPush(vBackup,iVar2);
      }
      iVar2 = Nf_ObjMapRefNum(p,uVar6,c_00);
      if (iVar2 < 0) {
        __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                      ,0x6cd,
                      "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)");
      }
      iVar2 = Nf_ObjMapRefInc(p,uVar6,c_00);
      if (iVar2 == 0) {
        wVar4 = Nf_MatchRef_rec(p,uVar6,c_00,p->pNfObjs[(int)uVar6].M[bVar9],Required - iVar1,
                                vBackup);
        local_58 = local_58 + wVar4;
      }
      bVar5 = bVar5 + 4;
    }
    pwVar7 = &p->pCells[*(uint *)pM & 0xfffff].AreaW;
  }
  else {
    iVar1 = p->InvDelayI;
    if (vBackup != (Vec_Int_t *)0x0) {
      iVar2 = Abc_Var2Lit(i,(uint)(c == 0));
      Vec_IntPush(vBackup,iVar2);
    }
    uVar6 = (uint)(c == 0);
    iVar2 = Nf_ObjMapRefNum(p,i,uVar6);
    if (iVar2 < 0) {
      __assert_fail("Nf_ObjMapRefNum(p, i, !c) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0x6c0,
                    "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, int, Vec_Int_t *)");
    }
    iVar2 = Nf_ObjMapRefInc(p,i,uVar6);
    if (iVar2 == 0) {
      local_58 = Nf_MatchRef_rec(p,i,uVar6,p->pNfObjs[i].M[c == 0],Required - iVar1,vBackup);
    }
    else {
      local_58 = 0;
    }
    pwVar7 = &p->InvAreaW;
  }
  return local_58 + *pwVar7;
}

Assistant:

word Nf_MatchRef_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, int Required, Vec_Int_t * vBackup )
{
    word Area = 0;
    int ReqFanin;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    assert( pM->D <= Required );
    if ( pM->fCompl )
    {
        ReqFanin = Required - p->InvDelayI;
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(i, !c) );
        assert( Nf_ObjMapRefNum(p, i, !c) >= 0 );
        if ( !Nf_ObjMapRefInc(p, i, !c) )
            Area += Nf_MatchRef_rec( p, i, !c, Nf_ObjMatchD(p, i, !c), ReqFanin, vBackup );
        return Area + p->InvAreaW;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        ReqFanin = Required - Nf_ManCell(p, pM->Gate)->iDelays[k];
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(iVar, fCompl) );
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) >= 0 );
        if ( !Nf_ObjMapRefInc(p, iVar, fCompl) )
            Area += Nf_MatchRef_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl), ReqFanin, vBackup );
    }
    return Area + Nf_ManCell(p, pM->Gate)->AreaW;
}